

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O2

BinaryRegionType flatbuffers::GetRegionType(BaseType base_type)

{
  BinaryRegionType BVar1;
  
  BVar1 = Unknown;
  if (base_type - UType < 0xc) {
    BVar1 = *(BinaryRegionType *)(&DAT_002840f0 + (ulong)(base_type - UType) * 4);
  }
  return BVar1;
}

Assistant:

inline static BinaryRegionType GetRegionType(reflection::BaseType base_type) {
  switch (base_type) {
    case reflection::UType: return BinaryRegionType::UType;
    case reflection::Bool: return BinaryRegionType::Uint8;
    case reflection::Byte: return BinaryRegionType::Uint8;
    case reflection::UByte: return BinaryRegionType::Uint8;
    case reflection::Short: return BinaryRegionType::Int16;
    case reflection::UShort: return BinaryRegionType::Uint16;
    case reflection::Int: return BinaryRegionType::Uint32;
    case reflection::UInt: return BinaryRegionType::Uint32;
    case reflection::Long: return BinaryRegionType::Int64;
    case reflection::ULong: return BinaryRegionType::Uint64;
    case reflection::Float: return BinaryRegionType::Float;
    case reflection::Double: return BinaryRegionType::Double;
    default: return BinaryRegionType::Unknown;
  }
}